

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O2

int uv_interface_addresses(uv_interface_address_t **addresses,int *count)

{
  sockaddr *psVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ifaddrs *in_RAX;
  int *piVar6;
  uv_interface_address_t *puVar7;
  char *pcVar8;
  uint uVar9;
  ifaddrs *ent;
  ifaddrs *ent_00;
  ifaddrs *ent_01;
  undefined4 uVar10;
  undefined4 uVar11;
  in_addr_t iVar12;
  undefined4 uVar13;
  ifaddrs *addrs;
  
  ent_00 = (ifaddrs *)&addrs;
  ent = (ifaddrs *)&addrs;
  ent_01 = (ifaddrs *)&addrs;
  addrs = in_RAX;
  iVar3 = getifaddrs(&addrs);
  if (iVar3 == 0) {
    *count = 0;
    *addresses = (uv_interface_address_t *)0x0;
    uVar9 = 0;
    while (ent_00 = ent_00->ifa_next, ent_00 != (ifaddrs *)0x0) {
      iVar3 = uv__ifaddr_exclude(ent_00);
      if (iVar3 == 0) {
        uVar9 = uVar9 + 1;
        *count = uVar9;
      }
    }
    iVar3 = 0;
    if (uVar9 != 0) {
      puVar7 = (uv_interface_address_t *)uv__malloc((ulong)uVar9 * 0x50);
      *addresses = puVar7;
      if (puVar7 == (uv_interface_address_t *)0x0) {
        freeifaddrs(addrs);
        iVar3 = -0xc;
      }
      else {
        while (ent = ent->ifa_next, ent != (ifaddrs *)0x0) {
          iVar4 = uv__ifaddr_exclude(ent);
          if (iVar4 == 0) {
            pcVar8 = uv__strdup(ent->ifa_name);
            puVar7->name = pcVar8;
            psVar1 = ent->ifa_addr;
            if (psVar1->sa_family == 10) {
              uVar10._0_2_ = psVar1->sa_family;
              uVar10._2_1_ = psVar1->sa_data[0];
              uVar10._3_1_ = psVar1->sa_data[1];
              iVar12 = *(in_addr_t *)(psVar1->sa_data + 2);
              uVar11 = *(undefined4 *)(psVar1->sa_data + 6);
              uVar13 = *(undefined4 *)(psVar1->sa_data + 10);
              uVar2 = *(undefined8 *)(psVar1[1].sa_data + 2);
              *(undefined8 *)((long)&puVar7->address + 0xc) = *(undefined8 *)(psVar1->sa_data + 10);
              *(undefined8 *)((long)&puVar7->address + 0x14) = uVar2;
            }
            else {
              uVar10._0_2_ = psVar1->sa_family;
              uVar10._2_1_ = psVar1->sa_data[0];
              uVar10._3_1_ = psVar1->sa_data[1];
              iVar12 = *(in_addr_t *)(psVar1->sa_data + 2);
              uVar11 = *(undefined4 *)(psVar1->sa_data + 6);
              uVar13 = *(undefined4 *)(psVar1->sa_data + 10);
            }
            *(undefined4 *)&puVar7->address = uVar10;
            (puVar7->address).address4.sin_addr.s_addr = iVar12;
            *(undefined4 *)((long)&puVar7->address + 8) = uVar11;
            *(undefined4 *)((long)&puVar7->address + 0xc) = uVar13;
            psVar1 = ent->ifa_netmask;
            if (psVar1->sa_family == 10) {
              uVar11._0_2_ = psVar1->sa_family;
              uVar11._2_1_ = psVar1->sa_data[0];
              uVar11._3_1_ = psVar1->sa_data[1];
              iVar12 = *(in_addr_t *)(psVar1->sa_data + 2);
              uVar10 = *(undefined4 *)(psVar1->sa_data + 6);
              uVar13 = *(undefined4 *)(psVar1->sa_data + 10);
              uVar2 = *(undefined8 *)(psVar1[1].sa_data + 2);
              *(undefined8 *)((long)&puVar7->netmask + 0xc) = *(undefined8 *)(psVar1->sa_data + 10);
              *(undefined8 *)((long)&puVar7->netmask + 0x14) = uVar2;
            }
            else {
              uVar11._0_2_ = psVar1->sa_family;
              uVar11._2_1_ = psVar1->sa_data[0];
              uVar11._3_1_ = psVar1->sa_data[1];
              iVar12 = *(in_addr_t *)(psVar1->sa_data + 2);
              uVar10 = *(undefined4 *)(psVar1->sa_data + 6);
              uVar13 = *(undefined4 *)(psVar1->sa_data + 10);
            }
            *(undefined4 *)&puVar7->netmask = uVar11;
            (puVar7->netmask).netmask4.sin_addr.s_addr = iVar12;
            *(undefined4 *)((long)&puVar7->netmask + 8) = uVar10;
            *(undefined4 *)((long)&puVar7->netmask + 0xc) = uVar13;
            puVar7->is_internal = ent->ifa_flags >> 3 & 1;
            puVar7 = puVar7 + 1;
          }
        }
        while (ent_01 = ent_01->ifa_next, ent_01 != (ifaddrs *)0x0) {
          iVar4 = uv__ifaddr_exclude(ent_01);
          if (iVar4 == 0) {
            pcVar8 = (*addresses)->phys_addr;
            for (iVar4 = 0; iVar4 < *count; iVar4 = iVar4 + 1) {
              iVar5 = strcmp(((uv_interface_address_t *)(pcVar8 + -8))->name,ent_01->ifa_name);
              if (iVar5 == 0) {
                psVar1 = ent_01->ifa_addr;
                *(sa_family_t *)(pcVar8 + 4) = psVar1[1].sa_family;
                *(undefined4 *)pcVar8 = *(undefined4 *)(psVar1->sa_data + 10);
              }
              pcVar8 = pcVar8 + 0x50;
            }
          }
        }
        freeifaddrs(addrs);
      }
    }
  }
  else {
    piVar6 = __errno_location();
    iVar3 = -*piVar6;
  }
  return iVar3;
}

Assistant:

int uv_interface_addresses(uv_interface_address_t** addresses,
  int* count) {
#ifndef HAVE_IFADDRS_H
  return -ENOSYS;
#else
  struct ifaddrs *addrs, *ent;
  uv_interface_address_t* address;
  int i;
  struct sockaddr_ll *sll;

  if (getifaddrs(&addrs))
    return -errno;

  *count = 0;
  *addresses = NULL;

  /* Count the number of interfaces */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent))
      continue;

    (*count)++;
  }

  if (*count == 0)
    return 0;

  *addresses = uv__malloc(*count * sizeof(**addresses));
  if (!(*addresses)) {
    freeifaddrs(addrs);
    return -ENOMEM;
  }

  address = *addresses;

  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent))
      continue;

    address->name = uv__strdup(ent->ifa_name);

    if (ent->ifa_addr->sa_family == AF_INET6) {
      address->address.address6 = *((struct sockaddr_in6*) ent->ifa_addr);
    } else {
      address->address.address4 = *((struct sockaddr_in*) ent->ifa_addr);
    }

    if (ent->ifa_netmask->sa_family == AF_INET6) {
      address->netmask.netmask6 = *((struct sockaddr_in6*) ent->ifa_netmask);
    } else {
      address->netmask.netmask4 = *((struct sockaddr_in*) ent->ifa_netmask);
    }

    address->is_internal = !!(ent->ifa_flags & IFF_LOOPBACK);

    address++;
  }

  /* Fill in physical addresses for each interface */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent))
      continue;

    address = *addresses;

    for (i = 0; i < (*count); i++) {
      if (strcmp(address->name, ent->ifa_name) == 0) {
        sll = (struct sockaddr_ll*)ent->ifa_addr;
        memcpy(address->phys_addr, sll->sll_addr, sizeof(address->phys_addr));
      }
      address++;
    }
  }

  freeifaddrs(addrs);

  return 0;
#endif
}